

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O2

string * __thiscall
ResponseBase::attribute<unsigned_long>
          (string *__return_storage_ptr__,ResponseBase *this,char *name,unsigned_long *value)

{
  ostream *poVar1;
  ostringstream stream;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar1 = std::operator<<((ostream *)aoStack_198,"[");
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string attribute(const char* name, const T& value) const {
        std::ostringstream stream;
        stream << "[" << name << ": " << value << "]";
        return stream.str();
    }